

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_register_name(Context_conflict2 *ctx,RegisterType *rtype,int *rnum)

{
  bool bVar1;
  bool bVar2;
  uint32 *puVar3;
  Token TVar4;
  int extraout_EAX;
  Token extraout_EAX_00;
  Token extraout_EAX_01;
  Token extraout_EAX_02;
  RegisterType RVar5;
  RegisterType RVar6;
  uint32 uVar7;
  uint32 ui32;
  uint32 local_3c;
  uint32 *local_38;
  
  TVar4 = nexttoken(ctx);
  if (TVar4 != TOKEN_IDENTIFIER) {
    failf(ctx,"%s","Expected register");
    return extraout_EAX;
  }
  local_38 = (uint32 *)rnum;
  TVar4 = check_token_segment(ctx,"oDepth");
  bVar1 = true;
  if (TVar4 != 0) {
    RVar6 = REG_TYPE_DEPTHOUT;
LAB_00151141:
    RVar5 = RVar6;
    uVar7 = 0;
    goto LAB_00151144;
  }
  TVar4 = check_token_segment(ctx,"vFace");
  RVar5 = REG_TYPE_MISCTYPE;
  uVar7 = 1;
  bVar2 = false;
  if (TVar4 != 0) goto LAB_001511c2;
  TVar4 = check_token_segment(ctx,"vPos");
  RVar5 = REG_TYPE_MISCTYPE;
  if (TVar4 == 0) {
    TVar4 = check_token_segment(ctx,"oPos");
    RVar5 = REG_TYPE_RASTOUT;
    if (TVar4 != 0) goto LAB_001511bf;
    TVar4 = check_token_segment(ctx,"oFog");
    if (TVar4 == 0) {
      TVar4 = check_token_segment(ctx,"oPts");
      uVar7 = 0;
      if (TVar4 != 0) {
        uVar7 = 2;
        goto LAB_00151144;
      }
      TVar4 = check_token_segment(ctx,"aL");
      if (TVar4 != 0) {
        RVar5 = REG_TYPE_LOOP;
        goto LAB_00151144;
      }
      TVar4 = check_token_segment(ctx,"oC");
      if (TVar4 != 0) {
        RVar6 = REG_TYPE_COLOROUT;
        goto LAB_00151327;
      }
      TVar4 = check_token_segment(ctx,"oT");
      bVar1 = false;
      RVar6 = REG_TYPE_OUTPUT;
      if (TVar4 != 0) goto LAB_00151141;
      TVar4 = check_token_segment(ctx,"oD");
      if (TVar4 != 0) {
        RVar6 = REG_TYPE_ATTROUT;
LAB_00151327:
        bVar1 = false;
        goto LAB_00151141;
      }
      TVar4 = check_token_segment(ctx,"r");
      bVar1 = false;
      uVar7 = 0;
      bVar2 = false;
      RVar5 = REG_TYPE_TEMP;
      if (TVar4 == 0) {
        TVar4 = check_token_segment(ctx,"v");
        if (TVar4 == 0) {
          TVar4 = check_token_segment(ctx,"c");
          if (TVar4 != 0) {
            bVar1 = false;
LAB_001513ca:
            uVar7 = 0;
            bVar2 = true;
            RVar5 = REG_TYPE_CONST;
            goto LAB_001511c2;
          }
          TVar4 = check_token_segment(ctx,"i");
          if (TVar4 == 0) {
            TVar4 = check_token_segment(ctx,"b");
            if (TVar4 == 0) {
              TVar4 = check_token_segment(ctx,"s");
              if (TVar4 == 0) {
                TVar4 = check_token_segment(ctx,"l");
                if (TVar4 == 0) {
                  TVar4 = check_token_segment(ctx,"p");
                  if (TVar4 == 0) {
                    TVar4 = check_token_segment(ctx,"o");
                    bVar1 = false;
                    uVar7 = 0;
                    bVar2 = false;
                    RVar5 = REG_TYPE_OUTPUT;
                    if (TVar4 == 0) {
                      TVar4 = check_token_segment(ctx,"a");
                      RVar5 = REG_TYPE_ADDRESS;
                      bVar1 = false;
                      RVar6 = REG_TYPE_ADDRESS;
                      if (TVar4 != 0) goto LAB_00151141;
                      TVar4 = check_token_segment(ctx,"t");
                      bVar1 = false;
                      uVar7 = 0;
                      bVar2 = false;
                      if (TVar4 == 0) {
                        failf(ctx,"%s","expected register type");
                        bVar1 = true;
                        TVar4 = extraout_EAX_02;
                        goto LAB_001513ca;
                      }
                    }
                    goto LAB_001511c2;
                  }
                  RVar6 = REG_TYPE_MAX;
                }
                else {
                  RVar6 = REG_TYPE_LABEL;
                }
              }
              else {
                RVar6 = REG_TYPE_SAMPLER;
              }
            }
            else {
              RVar6 = REG_TYPE_CONSTBOOL;
            }
          }
          else {
            RVar6 = REG_TYPE_CONSTINT;
          }
        }
        else {
          RVar6 = REG_TYPE_INPUT;
        }
        goto LAB_00151327;
      }
    }
    else {
LAB_00151144:
      bVar2 = false;
    }
  }
  else {
LAB_001511bf:
    bVar2 = false;
    uVar7 = 0;
  }
LAB_001511c2:
  if (!bVar1) {
    if (ctx->tokenlen == 0) {
      TVar4 = nexttoken(ctx);
      if (ctx->pushedback != 0) {
        __assert_fail("!ctx->pushedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                      ,0x9f,"void pushback(Context *)");
      }
      ctx->pushedback = 1;
      ctx->tokenlen = 0;
      if (TVar4 == 0x5b) goto LAB_0015122a;
    }
    local_3c = 0;
    TVar4 = ui32fromtoken(ctx,&local_3c);
    uVar7 = local_3c;
    if (TVar4 == 0) {
      failf(ctx,"%s","Invalid register index");
      uVar7 = local_3c;
      TVar4 = extraout_EAX_00;
    }
  }
LAB_0015122a:
  puVar3 = local_38;
  if ((bVar2) && (RVar5 = REG_TYPE_CONST, 0x7ff < (int)uVar7)) {
    if ((int)uVar7 < 0x1000) {
      uVar7 = uVar7 - 0x800;
      RVar5 = REG_TYPE_CONST2;
    }
    else if ((int)uVar7 < 0x1800) {
      uVar7 = uVar7 - 0x1000;
      RVar5 = REG_TYPE_CONST3;
    }
    else if ((int)uVar7 < 0x2000) {
      uVar7 = uVar7 - 0x1800;
      RVar5 = REG_TYPE_CONST4;
    }
    else {
      failf(ctx,"%s","Invalid const register index");
      TVar4 = extraout_EAX_01;
    }
  }
  *rtype = RVar5;
  *puVar3 = uVar7;
  return TVar4;
}

Assistant:

static int parse_register_name(Context *ctx, RegisterType *rtype, int *rnum)
{
    if (nexttoken(ctx) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected register");
        return 0;
    } // if

    int neednum = 1;
    int regnum = 0;
    RegisterType regtype = REG_TYPE_TEMP;

    // Watch out for substrings! oDepth must be checked before oD, since
    //  the latter will match either case.
    if (check_token_segment(ctx, "oDepth"))
    {
        regtype = REG_TYPE_DEPTHOUT;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vFace"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_FACE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vPos"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPos"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oFog"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_FOG;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPts"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POINT_SIZE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "aL"))
    {
        regtype = REG_TYPE_LOOP;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oC"))
        regtype = REG_TYPE_COLOROUT;
    else if (check_token_segment(ctx, "oT"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "oD"))
        regtype = REG_TYPE_ATTROUT;
    else if (check_token_segment(ctx, "r"))
        regtype = REG_TYPE_TEMP;
    else if (check_token_segment(ctx, "v"))
        regtype = REG_TYPE_INPUT;
    else if (check_token_segment(ctx, "c"))
        regtype = REG_TYPE_CONST;
    else if (check_token_segment(ctx, "i"))
        regtype = REG_TYPE_CONSTINT;
    else if (check_token_segment(ctx, "b"))
        regtype = REG_TYPE_CONSTBOOL;
    else if (check_token_segment(ctx, "s"))
        regtype = REG_TYPE_SAMPLER;
    else if (check_token_segment(ctx, "l"))
        regtype = REG_TYPE_LABEL;
    else if (check_token_segment(ctx, "p"))
        regtype = REG_TYPE_PREDICATE;
    else if (check_token_segment(ctx, "o"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "a"))
        regtype = REG_TYPE_ADDRESS;
    else if (check_token_segment(ctx, "t"))
        regtype = REG_TYPE_ADDRESS;
        
    //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string

    else
    {
        fail(ctx, "expected register type");
        regtype = REG_TYPE_CONST;
        regnum = 0;
        neednum = 0;
    } // else

    // "c[5]" is the same as "c5", so if the token is done, see if next is '['.
    if ((neednum) && (ctx->tokenlen == 0))
    {
        const int tlen = ctx->tokenlen;  // we need to protect this for later.
        if (nexttoken(ctx) == ((Token) '['))
            neednum = 0;  // don't need a number on register name itself.
        pushback(ctx);
        ctx->tokenlen = tlen;
    } // if

    if (neednum)
    {
        uint32 ui32 = 0;
        if (!ui32fromtoken(ctx, &ui32))
            fail(ctx, "Invalid register index");
        regnum = (int) ui32;
    } // if

    // split up REG_TYPE_CONST
    if (regtype == REG_TYPE_CONST)
    {
        if (regnum < 2048)
        {
            regtype = REG_TYPE_CONST;
            regnum -= 0;
        } // if
        else if (regnum < 4096)
        {
            regtype = REG_TYPE_CONST2;
            regnum -= 2048;
        } // if
        else if (regnum < 6144)
        {
            regtype = REG_TYPE_CONST3;
            regnum -= 4096;
        } // if
        else if (regnum < 8192)
        {
            regtype = REG_TYPE_CONST4;
            regnum -= 6144;
        } // if
        else
        {
            fail(ctx, "Invalid const register index");
        } // else
    } // if

    *rtype = regtype;
    *rnum = regnum;

    return 1;
}